

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  UnknownFieldSet *this_01;
  char *description;
  Descriptor *pDVar3;
  Metadata MVar4;
  
  MVar4 = Message::GetMetadata(message);
  if (MVar4.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar4 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,MVar4.descriptor,field,"SetEnumValue");
  }
  pDVar3 = this->descriptor_;
  if (field->containing_type_ == pDVar3) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
      }
      bVar1 = internal::CreateUnknownEnumValues(field);
      if (!bVar1) {
        this_00 = FieldDescriptor::enum_type(field);
        pEVar2 = EnumDescriptor::FindValueByNumber(this_00,value);
        if (pEVar2 == (EnumValueDescriptor *)0x0) {
          this_01 = MutableUnknownFields(this,message);
          UnknownFieldSet::AddVarint(this_01,field->number_,(long)value);
          return;
        }
      }
      SetEnumValueInternal(this,message,field,value);
      return;
    }
    pDVar3 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,"SetEnumValue",description);
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}